

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderImageLoadStoreTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::getFunctionName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,ImageOperation function)

{
  allocator<char> local_2e;
  allocator<char> local_2d;
  allocator<char> local_2c;
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  undefined4 local_14;
  string *psStack_10;
  ImageOperation function_local;
  
  local_14 = SUB84(this,0);
  psStack_10 = __return_storage_ptr__;
  switch((ulong)this & 0xffffffff) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"imageStore",&local_15);
    std::allocator<char>::~allocator(&local_15);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"imageLoad",local_25);
    std::allocator<char>::~allocator(local_25);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"imageAtomicAdd",&local_26);
    std::allocator<char>::~allocator(&local_26);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"imageAtomicMin",&local_27);
    std::allocator<char>::~allocator(&local_27);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"imageAtomicMax",&local_28);
    std::allocator<char>::~allocator(&local_28);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"imageAtomicAnd",&local_29);
    std::allocator<char>::~allocator(&local_29);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"imageAtomicOr",&local_2a);
    std::allocator<char>::~allocator(&local_2a);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"imageAtomicXor",&local_2b);
    std::allocator<char>::~allocator(&local_2b);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"imageAtomicExchange",&local_2c);
    std::allocator<char>::~allocator(&local_2c);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"imageAtomicCompSwap",&local_2d);
    std::allocator<char>::~allocator(&local_2d);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getFunctionName (ImageOperation function)
{
	switch (function)
	{
		case IMAGE_OPERATION_STORE:				return std::string("imageStore");
		case IMAGE_OPERATION_LOAD:				return std::string("imageLoad");
		case IMAGE_OPERATION_ATOMIC_ADD:		return std::string("imageAtomicAdd");
		case IMAGE_OPERATION_ATOMIC_MIN:		return std::string("imageAtomicMin");
		case IMAGE_OPERATION_ATOMIC_MAX:		return std::string("imageAtomicMax");
		case IMAGE_OPERATION_ATOMIC_AND:		return std::string("imageAtomicAnd");
		case IMAGE_OPERATION_ATOMIC_OR:			return std::string("imageAtomicOr");
		case IMAGE_OPERATION_ATOMIC_XOR:		return std::string("imageAtomicXor");
		case IMAGE_OPERATION_ATOMIC_EXCHANGE:	return std::string("imageAtomicExchange");
		case IMAGE_OPERATION_ATOMIC_COMP_SWAP:	return std::string("imageAtomicCompSwap");
		default:
			DE_ASSERT(DE_FALSE);
	}
	return std::string("");
}